

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O0

__m256i * hsum4_avx2(__m256i *x0,__m256i *x1,__m256i *x2,__m256i *x3)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i *in_RCX;
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  
  auVar4 = vpunpckldq_avx2(*in_RDI,*in_RSI);
  auVar5 = vpunpckldq_avx2(*in_RDX,(undefined1  [32])*in_RCX);
  auVar1 = vpunpckhdq_avx2(*in_RDI,*in_RSI);
  auVar2 = vpunpckhdq_avx2(*in_RDX,(undefined1  [32])*in_RCX);
  auVar6 = vpunpcklqdq_avx2(auVar4,auVar5);
  *in_RDI = auVar6;
  auVar4 = vpunpckhqdq_avx2(auVar4,auVar5);
  *in_RSI = auVar4;
  auVar4 = vpunpcklqdq_avx2(auVar1,auVar2);
  *in_RDX = auVar4;
  alVar3 = (__m256i)vpunpckhqdq_avx2(auVar1,auVar2);
  *in_RCX = alVar3;
  auVar1 = vpaddd_avx2(*in_RDI,*in_RSI);
  auVar2 = vpaddd_avx2(*in_RDX,(undefined1  [32])*in_RCX);
  vpaddd_avx2(auVar1,auVar2);
  return in_RCX;
}

Assistant:

static inline __m256i hsum4_avx2(__m256i *x0, __m256i *x1, __m256i *x2,
                                 __m256i *x3) {
  const __m256i t0 = _mm256_unpacklo_epi32(*x0, *x1);
  const __m256i t1 = _mm256_unpacklo_epi32(*x2, *x3);
  const __m256i t2 = _mm256_unpackhi_epi32(*x0, *x1);
  const __m256i t3 = _mm256_unpackhi_epi32(*x2, *x3);

  *x0 = _mm256_unpacklo_epi64(t0, t1);
  *x1 = _mm256_unpackhi_epi64(t0, t1);
  *x2 = _mm256_unpacklo_epi64(t2, t3);
  *x3 = _mm256_unpackhi_epi64(t2, t3);
  return _mm256_add_epi32(_mm256_add_epi32(*x0, *x1),
                          _mm256_add_epi32(*x2, *x3));
}